

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall Js::InterpreterStackFrame::InitializeClosures(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint32 uVar4;
  RegSlot RVar5;
  FunctionBody *this_00;
  Var pvVar6;
  undefined4 *puVar7;
  FrameDisplay *local_38;
  
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  if ((this_00->field_0x17b & 4) != 0) {
    this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] | 2);
  }
  RVar3 = FunctionBody::GetThisRegisterForEventHandler(this_00);
  if (RVar3 == 0xffffffff) {
    if (*(long *)(this + 0x60) == 0) {
      local_38 = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
    }
    else {
      if ((this_00->field_0x17b & 4) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x603,"(!executeFunction->IsParamAndBodyScopeMerged())",
                                    "!executeFunction->IsParamAndBodyScopeMerged()");
        if (!bVar2) goto LAB_009752a6;
        *puVar7 = 0;
      }
      local_38 = GetLocalFrameDisplay(this);
    }
  }
  else {
    pvVar6 = (Var)**(undefined8 **)(this + 0x20);
    SetReg<unsigned_int>(this,RVar3,pvVar6);
    local_38 = JavascriptOperators::OP_LdHandlerScope(pvVar6,*(ScriptContext **)(this + 0x78));
    ScriptFunction::SetEnvironment(*(ScriptFunction **)(this + 0x80),local_38);
  }
  RVar3 = FunctionBody::GetFuncExprScopeRegister(this_00);
  pvVar6 = (void *)0x0;
  if ((RVar3 != 0xffffffff) && (*(long *)(this + 0x60) == 0)) {
    pvVar6 = JavascriptOperators::OP_NewPseudoScope(*(ScriptContext **)(this + 0x78));
    SetReg<unsigned_int>(this,RVar3,pvVar6);
  }
  RVar3 = FunctionBody::GetLocalClosureRegister(this_00);
  if (RVar3 != 0xffffffff) {
    uVar4 = FunctionBody::GetCountField(this_00,ConstantCount);
    if (RVar3 < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x619,"(closureReg >= executeFunction->GetConstantCount())",
                                  "closureReg >= executeFunction->GetConstantCount()");
      if (!bVar2) goto LAB_009752a6;
      *puVar7 = 0;
    }
    if (this_00->hasScopeObject == true) {
      NewScopeObject(this);
    }
    else {
      NewScopeSlots(this);
    }
    *(undefined8 *)(this + (ulong)RVar3 * 8 + 0x160) = 0;
  }
  RVar5 = FunctionBody::GetLocalFrameDisplayRegister(this_00);
  if (RVar5 != 0xffffffff) {
    uVar4 = FunctionBody::GetCountField(this_00,ConstantCount);
    if (RVar5 < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x628,"(frameDisplayReg >= executeFunction->GetConstantCount())",
                                  "frameDisplayReg >= executeFunction->GetConstantCount()");
      if (!bVar2) {
LAB_009752a6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    if (pvVar6 != (void *)0x0) {
      local_38 = OP_LdFrameDisplay(this,pvVar6,local_38,*(ScriptContext **)(this + 0x78));
    }
    if (RVar3 != 0xffffffff) {
      local_38 = NewFrameDisplay(this,*(void **)(this + 0x58),local_38);
    }
    *(FrameDisplay **)(this + 0x50) = local_38;
    *(undefined8 *)(this + (ulong)RVar5 * 8 + 0x160) = 0;
  }
  this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] | 1);
  return;
}

Assistant:

void InterpreterStackFrame::InitializeClosures()
    {
        FunctionBody *executeFunction = this->function->GetFunctionBody();
        Var environment;

        if (executeFunction->IsParamAndBodyScopeMerged())
        {
            this->SetIsParamScopeDone(true);
        }

        RegSlot thisRegForEventHandler = executeFunction->GetThisRegisterForEventHandler();
        if (thisRegForEventHandler != Constants::NoRegister)
        {
            Var varThis = OP_ArgIn0();
            SetReg(thisRegForEventHandler, varThis);
            environment = JavascriptOperators::OP_LdHandlerScope(varThis, GetScriptContext());
            this->SetEnv((FrameDisplay*)environment);
        }
        else if (this->paramClosure != nullptr)
        {
            // When paramClosure is non-null we are calling this method to initialize the closure for body scope.
            // In this case we have to use the param scope's closure as the parent for the body scope's frame display.
            Assert(!executeFunction->IsParamAndBodyScopeMerged());
            environment = this->GetLocalFrameDisplay();
        }
        else
        {
            environment = this->LdEnv();
        }

        Var funcExprScope = nullptr;
        Js::RegSlot funcExprScopeReg = executeFunction->GetFuncExprScopeRegister();
        if (funcExprScopeReg != Constants::NoRegister && this->paramClosure == nullptr)
        {
            // t0 = NewPseudoScope
            // t1 = LdFrameDisplay t0 env

            funcExprScope = JavascriptOperators::OP_NewPseudoScope(GetScriptContext());
            SetReg(funcExprScopeReg, funcExprScope);
        }

        RegSlot closureReg = executeFunction->GetLocalClosureRegister();
        if (closureReg != Js::Constants::NoRegister)
        {
            Assert(closureReg >= executeFunction->GetConstantCount());
            if (executeFunction->HasScopeObject())
            {
                this->NewScopeObject();
            }
            else
            {
                this->NewScopeSlots();
            }
            this->SetNonVarReg(closureReg, nullptr);
        }

        Js::RegSlot frameDisplayReg = executeFunction->GetLocalFrameDisplayRegister();
        if (frameDisplayReg != Js::Constants::NoRegister)
        {
            Assert(frameDisplayReg >= executeFunction->GetConstantCount());

            if (funcExprScope != nullptr)
            {
                environment = OP_LdFrameDisplay(funcExprScope, environment, GetScriptContext());
            }

            if (closureReg != Js::Constants::NoRegister)
            {
                void *argHead = this->GetLocalClosure();
                environment = this->NewFrameDisplay(argHead, environment);
            }

            this->SetLocalFrameDisplay((Js::FrameDisplay*)environment);
            this->SetNonVarReg(frameDisplayReg, nullptr);
        }

        this->closureInitDone = true;
    }